

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::AllocPages<true>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint pageCount)

{
  PageBitVector *this_00;
  SecondaryAllocator *pSVar1;
  PageAllocatorBaseCommon *pPVar2;
  HANDLE pVVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BVIndex BVar7;
  int iVar8;
  BVIndex BVar9;
  uint uVar10;
  BOOL BVar11;
  undefined8 in_RAX;
  HANDLE pVVar12;
  AllocatorType *pAVar13;
  char *message;
  char *error;
  char *lpAddress;
  undefined4 *puVar14;
  undefined8 *in_FS_OFFSET;
  undefined8 local_38;
  DWORD oldProtect;
  
  local_38 = in_RAX;
  if (this->freePageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)*in_FS_OFFSET;
    *puVar14 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar5) goto LAB_00264158;
    *puVar14 = 0;
  }
  BVar9 = this->freePageCount;
  this_00 = &this->freePages;
  BVar7 = BVStatic<272UL>::Count(this_00);
  if (BVar9 != BVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)*in_FS_OFFSET;
    *puVar14 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar5) goto LAB_00264158;
    *puVar14 = 0;
  }
  if (pageCount <= this->freePageCount) {
    if ((this->freePageCount == 0 && this->decommitPageCount == 0) ||
       ((pSVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                  secondaryAllocator, pSVar1 != (SecondaryAllocator *)0x0 &&
        (iVar8 = (*pSVar1->_vptr_SecondaryAllocator[3])(), (char)iVar8 == '\0')))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)*in_FS_OFFSET;
      *puVar14 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x158,"(!IsFull())","!IsFull()");
      if (!bVar5) {
LAB_00264158:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar14 = 0;
    }
    BVar9 = BVStatic<272UL>::GetNextBit(this_00,0);
    if (BVar9 == 0xffffffff) {
      return (char *)0x0;
    }
    puVar14 = (undefined4 *)*in_FS_OFFSET;
    local_38 = CONCAT44(BVar9,(DWORD)local_38);
    do {
      pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               super_SegmentBaseCommon.allocator;
      pAVar13 = &pPVar2[-1].allocatorType;
      if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
        pAVar13 = (AllocatorType *)0x0;
      }
      if (pAVar13[0x28] <= BVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar5) goto LAB_00264158;
        *puVar14 = 0;
      }
      uVar10 = GetAvailablePageCount(this);
      if (uVar10 - BVar9 < pageCount) {
        return (char *)0x0;
      }
      if (pageCount == 1) {
        BVar9 = local_38._4_4_;
LAB_00263fd8:
        lpAddress = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                    (BVar9 << 0xc);
        BVStatic<272UL>::ClearRange(this_00,BVar9,pageCount);
        BVar7 = this->freePageCount - pageCount;
        this->freePageCount = BVar7;
        BVar9 = BVStatic<272UL>::Count(this_00);
        if (BVar7 != BVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)*in_FS_OFFSET;
          *puVar14 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                             "freePageCount == (uint)this->GetCountOfFreePages()");
          if (!bVar5) goto LAB_00264158;
          *puVar14 = 0;
        }
        pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        pAVar13 = &pPVar2[-1].allocatorType;
        if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
          pAVar13 = (AllocatorType *)0x0;
        }
        pVVar3 = *(HANDLE *)(pAVar13 + 0x4a);
        pVVar12 = GetCurrentProcess();
        if (pVVar3 != pVVar12) {
          return lpAddress;
        }
        BVar11 = VirtualProtect(lpAddress,(ulong)(pageCount << 0xc),4,(PDWORD)&local_38);
        if (BVar11 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)*in_FS_OFFSET;
          *puVar14 = 1;
          error = "((0))";
          message = "UNREACHED";
          uVar10 = 0x180;
        }
        else {
          if ((DWORD)local_38 == 1) goto LAB_0026413e;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)*in_FS_OFFSET;
          *puVar14 = 1;
          error = "(oldProtect == 0x01)";
          message = "oldProtect == PAGE_NOACCESS";
          uVar10 = 0x183;
        }
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,uVar10,error,message);
        if (bVar5) {
          *puVar14 = 0;
LAB_0026413e:
          if (BVar11 == 0) {
            return (char *)0x0;
          }
          return lpAddress;
        }
        goto LAB_00264158;
      }
      BVar6 = BVStatic<272UL>::TestRange(this_00,BVar9,pageCount);
      if (BVar6 != '\0') goto LAB_00263fd8;
      BVar9 = BVStatic<272UL>::GetNextBit(this_00,BVar9 + 1);
    } while (BVar9 != 0xffffffff);
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}